

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_inv_m(REF_DBL *m,REF_DBL *inv_m)

{
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL inv [9];
  REF_DBL local_68;
  REF_DBL a [9];
  REF_DBL *inv_m_local;
  REF_DBL *m_local;
  
  a[8] = (REF_DBL)inv_m;
  m_local._4_4_ = ref_matrix_m_full(m,&local_68);
  if (m_local._4_4_ == 0) {
    m_local._4_4_ = ref_matrix_inv_gen(3,&local_68,(REF_DBL *)&ref_private_macro_code_rss_1);
    if (m_local._4_4_ == 0) {
      m_local._4_4_ = ref_matrix_full_m((REF_DBL *)&ref_private_macro_code_rss_1,(REF_DBL *)a[8]);
      if (m_local._4_4_ == 0) {
        m_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
               0x1ec,"ref_matrix_inv_m",(ulong)m_local._4_4_,"full");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             0x1eb,"ref_matrix_inv_m",(ulong)m_local._4_4_,"general inverse");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x1ea,
           "ref_matrix_inv_m",(ulong)m_local._4_4_,"full");
  }
  return m_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_inv_m(REF_DBL *m, REF_DBL *inv_m) {
  /* the general inv has better stability by avoiding det */
  REF_DBL a[9], inv[9];

  RSS(ref_matrix_m_full(m, a), "full");
  RSS(ref_matrix_inv_gen(3, a, inv), "general inverse");
  RSS(ref_matrix_full_m(inv, inv_m), "full");

  return REF_SUCCESS;
}